

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x64.c
# Opt level: O1

MCodeChunk * jit_assemble(MCodeChunk *__return_storage_ptr__,Trace *trace)

{
  IrIns *pIVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  ushort uVar6;
  ulong uVar7;
  ulong uVar8;
  char *__format;
  int reg;
  long lVar9;
  ushort uVar10;
  int reg_1;
  long lVar11;
  IrRef reg_end [16];
  ushort local_58 [20];
  
  iVar4 = trace->ir_count;
  pvVar3 = calloc((long)iVar4,2);
  uVar6 = (short)iVar4 - 1;
  if (uVar6 != 0) {
    pIVar1 = trace->ir;
    uVar5 = (ulong)uVar6;
    do {
      uVar8 = pIVar1[uVar5];
      if ((uVar8 & 0xff00) != 0) {
        uVar7 = uVar8 >> 0x10 & 0xffff;
        if (*(short *)((long)pvVar3 + uVar7 * 2) == 0) {
          *(short *)((long)pvVar3 + uVar7 * 2) = (short)uVar5;
        }
        uVar8 = uVar8 >> 0x20 & 0xffff;
        if (*(short *)((long)pvVar3 + uVar8 * 2) == 0) {
          *(short *)((long)pvVar3 + uVar8 * 2) = (short)uVar5;
        }
      }
      uVar5 = uVar5 - 1;
    } while ((short)uVar5 != 0);
  }
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[0xc] = 0;
  local_58[0xd] = 0;
  local_58[0xe] = 0;
  local_58[0xf] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  if (1 < iVar4) {
    pIVar1 = trace->ir;
    uVar6 = 1;
    do {
      lVar9 = 0;
      do {
        uVar10 = local_58[lVar9];
        if (uVar10 == uVar6) {
          uVar10 = 0;
        }
        local_58[lVar9] = uVar10;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x10);
      uVar5 = (ulong)uVar6;
      lVar11 = 0;
      lVar9 = 0;
      while (local_58[lVar9] != 0) {
        lVar9 = lVar9 + 1;
        lVar11 = lVar11 + -0x1000000000000;
        if (lVar9 == 0x10) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/jit/asm/x64.c"
                        ,0x7a,"void asm_allocate_registers(Trace *)");
        }
      }
      pIVar1[uVar5] = (pIVar1[uVar5] & 0xffffffffffff) - lVar11;
      local_58[lVar9] = *(ushort *)((long)pvVar3 + uVar5 * 2);
      uVar6 = uVar6 + 1;
    } while ((int)(uint)uVar6 < iVar4);
  }
  asm_new();
  if (1 < (uint)trace->ir_count) {
    uVar5 = 1;
    do {
      pIVar1 = trace->ir;
      uVar8 = pIVar1[uVar5];
      uVar2 = (uint)uVar8 & 0xffff;
      if (uVar2 == 0x100) {
        uVar7 = pIVar1[uVar8 >> 0x20 & 0xffff];
        if (uVar8 >> 0x30 != pIVar1[uVar8 >> 0x10 & 0xffff] >> 0x30) {
          printf("movsd xmm%d, xmm%d\n",uVar8 >> 0x30,pIVar1[uVar8 >> 0x10 & 0xffff] >> 0x30);
        }
        uVar7 = uVar7 >> 0x30;
        __format = "addsd xmm%d, xmm%d\n";
LAB_00113981:
        printf(__format,uVar8 >> 0x30,uVar7);
      }
      else if (uVar2 == 1) {
        printf("movsd xmm%d, [0x%zx]\n",uVar8 >> 0x30,
               (uVar8 >> 0xd & 0x7fffffff8) + (long)trace->vm->consts);
      }
      else if ((uVar8 & 0xffff) == 0) {
        iVar4 = (int)(uVar8 >> 0x10);
        if (iVar4 != 0) {
          uVar7 = (ulong)(uint)(iVar4 << 3);
          __format = "movsd xmm%d, [rdx + 0x%x]\n";
          goto LAB_00113981;
        }
        printf("movsd xmm%d, [rdx]\n",uVar8 >> 0x30);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)(long)trace->ir_count);
  }
  return __return_storage_ptr__;
}

Assistant:

MCodeChunk jit_assemble(Trace *trace) {
	// Perform register allocation first
	asm_allocate_registers(trace);

	// Create an empty machine code chunk
	MCodeChunk chunk = asm_new();

	// Assemble the IR instruction by instruction
	for (size_t i = 1; i < trace->ir_count; i++) {
		asm_ins(&chunk, trace, trace->ir[i]);
	}

	return chunk;
}